

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IsFlat(CordRepBtree *this,string_view *fragment)

{
  bool bVar1;
  ulong index;
  string_view sVar2;
  
  if (((this->super_CordRep).storage[0] == '\0') &&
     (index = (ulong)(this->super_CordRep).storage[1], (this->super_CordRep).storage[2] - index == 1
     )) {
    bVar1 = true;
    if (fragment != (string_view *)0x0) {
      sVar2 = Data(this,index);
      *fragment = sVar2;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CordRepBtree::IsFlat(absl::string_view* fragment) const {
  if (height() == 0 && size() == 1) {
    if (fragment) *fragment = Data(begin());
    return true;
  }
  return false;
}